

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_eval.h
# Opt level: O0

double mp::ComputeValue<mp::VarInfoRecomp>(LogAConstraint *con,VarInfoRecomp *x)

{
  const_reference pvVar1;
  VarInfoImpl<mp::VarVecRecomp> *in_RSI;
  long in_RDI;
  double dVar2;
  double dVar3;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  
  CustomConstraintData<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::LogAId>::GetArguments
            ((CustomConstraintData<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::LogAId> *)
             (in_RDI + 0x28));
  std::array<int,_1UL>::operator[]
            ((array<int,_1UL> *)in_RSI,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)
            );
  dVar2 = VarInfoImpl<mp::VarVecRecomp>::operator[](in_RSI,in_stack_ffffffffffffffdc);
  dVar2 = log(dVar2);
  CustomConstraintData<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::LogAId>::GetParameters
            ((CustomConstraintData<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::LogAId> *)
             (in_RDI + 0x28));
  pvVar1 = std::array<double,_1UL>::operator[]
                     ((array<double,_1UL> *)in_RSI,
                      CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  dVar3 = log(*pvVar1);
  return dVar2 / dVar3;
}

Assistant:

double ComputeValue(const LogAConstraint& con, const VarVec& x) {
  return
      std::log(x[con.GetArguments()[0]])
      / std::log(con.GetParameters()[0]);
}